

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_test_cases.cpp
# Opt level: O3

string * (anonymous_namespace)::get_name_abi_cxx11_(pbf_reader layer)

{
  bool bVar1;
  string *psVar2;
  string *extraout_RAX;
  string *in_RDI;
  AssertionHandler catchAssertionHandler;
  StringRef local_98;
  AssertionHandler local_88;
  StringRef local_40;
  SourceLineInfo local_30;
  
  bVar1 = protozero::pbf_reader::next((pbf_reader *)&stack0x00000008,1);
  if (bVar1) {
    local_88.m_assertionInfo.macroName =
         (StringRef)protozero::pbf_reader::get_view((pbf_reader *)&stack0x00000008);
    psVar2 = protozero::data_view::operator_cast_to_string(in_RDI,(data_view *)&local_88);
  }
  else {
    local_98.m_start = "REQUIRE";
    local_98.m_size = 7;
    local_30.file =
         "/workspace/llm4binary/github/license_c_cmakelists/mapbox[P]protozero/test/t/vector_tile/reader_test_cases.cpp"
    ;
    local_30.line = 0x10;
    Catch::StringRef::StringRef(&local_40,"false");
    Catch::AssertionHandler::AssertionHandler(&local_88,&local_98,&local_30,local_40,Normal);
    local_98.m_start = (char *)((ulong)local_98.m_start & 0xffffffffffffff00);
    Catch::AssertionHandler::handleExpr<bool>(&local_88,(ExprLhs<bool> *)&local_98);
    Catch::AssertionHandler::complete(&local_88);
    if (local_88.m_completed == false) {
      (*(local_88.m_resultCapture)->_vptr_IResultCapture[0xe])();
    }
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char_const*>();
    psVar2 = extraout_RAX;
  }
  return psVar2;
}

Assistant:

std::string get_name(protozero::pbf_reader layer) { // copy!
    while (layer.next(1)) { // required string name
        return layer.get_string();
    }
    REQUIRE(false); // should never be here
    return "";
}